

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O2

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CNegativeExpression *exp)

{
  initializer_list<INode_*> __l;
  allocator_type local_c1;
  _Vector_base<INode_*,_std::allocator<INode_*>_> local_c0;
  string local_a8;
  vector<INode_*,_std::allocator<INode_*>_> children;
  ChildrenAnswers answers;
  ChildrenAnswers local_40;
  
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(exp->expression)._M_t.
                super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  __l._M_len = 1;
  __l._M_array = (iterator)&answers;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&children,__l,&local_c1);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)&local_c0,&children);
  VisitChildren(&answers,this,(vector<INode_*,_std::allocator<INode_*>_> *)&local_c0);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base(&local_c0);
  ChildrenAnswers::ChildrenAnswers(&local_40,&answers);
  AddChildrenAnswers(this,(ChildrenAnswers *)&local_40);
  ChildrenAnswers::~ChildrenAnswers(&local_40);
  std::__cxx11::string::string((string *)&local_a8,"Negative",(allocator *)&local_c1);
  AddLabel(this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)&answers);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base
            (&children.super__Vector_base<INode_*,_std::allocator<INode_*>_>);
  return;
}

Assistant:

void CPrintVisitor::Visit(CNegativeExpression &exp)
{
	std::vector<INode*> children = { exp.expression.get() };
	ChildrenAnswers answers = VisitChildren(children);
	AddChildrenAnswers(answers);
	AddLabel("Negative");
	++lastVisited;	
}